

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

bool __thiscall flatbuffers::SwiftGRPCGenerator::generate(SwiftGRPCGenerator *this)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  pointer file_00;
  char *name;
  Service *service_00;
  undefined1 local_f8 [8];
  string filename;
  string final_code;
  undefined1 local_98 [8];
  unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
  service;
  undefined1 local_88 [4];
  int i;
  FlatBufFile file;
  allocator<char> local_31;
  string local_30;
  SwiftGRPCGenerator *local_10;
  SwiftGRPCGenerator *this_local;
  
  local_10 = this;
  CodeWriter::Clear(&this->code_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"// Generated GRPC code for FlatBuffers swift!",&local_31);
  CodeWriter::operator+=(&this->code_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  grpc_swift_generator::GenerateHeader_abi_cxx11_();
  CodeWriter::operator+=(&this->code_,(string *)&file.language_);
  std::__cxx11::string::~string((string *)&file.language_);
  FlatBufFile::FlatBufFile
            ((FlatBufFile *)local_88,(this->super_BaseGenerator).parser_,
             (this->super_BaseGenerator).file_name_,kLanguageSwift);
  service._M_t.
  super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
  .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ = 0;
  while( true ) {
    iVar1 = service._M_t.
            super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
            .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_;
    uVar3 = FlatBufFile::service_count((FlatBufFile *)local_88);
    service_00 = (Service *)(ulong)uVar3;
    if ((int)uVar3 <= iVar1) break;
    FlatBufFile::service((FlatBufFile *)local_98,(int)local_88);
    file_00 = std::
              unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
              ::get((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                     *)local_98);
    grpc_swift_generator::Generate_abi_cxx11_
              ((string *)((long)&final_code.field_2 + 8),(grpc_swift_generator *)local_88,
               (File *)file_00,service_00);
    CodeWriter::operator+=(&this->code_,(string *)((long)&final_code.field_2 + 8));
    std::__cxx11::string::~string((string *)(final_code.field_2._M_local_buf + 8));
    std::
    unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>::
    ~unique_ptr((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                 *)local_98);
    service._M_t.
    super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
    .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ =
         service._M_t.
         super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
         .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ + 1;
  }
  CodeWriter::ToString_abi_cxx11_((string *)((long)&filename.field_2 + 8),&this->code_);
  GeneratedFileName((string *)local_f8,(this->super_BaseGenerator).path_,
                    (this->super_BaseGenerator).file_name_);
  name = (char *)std::__cxx11::string::c_str();
  bVar2 = SaveFile(name,(string *)((long)&filename.field_2 + 8),false);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  FlatBufFile::~FlatBufFile((FlatBufFile *)local_88);
  return bVar2;
}

Assistant:

bool generate() {
    code_.Clear();
    code_ += "// Generated GRPC code for FlatBuffers swift!";
    code_ += grpc_swift_generator::GenerateHeader();
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageSwift);
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      code_ += grpc_swift_generator::Generate(&file, service.get());
    }
    const auto final_code = code_.ToString();
    const auto filename = GeneratedFileName(path_, file_name_);
    return SaveFile(filename.c_str(), final_code, false);
  }